

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::queryEnterOrder(Application *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Application *this_00;
  Message order;
  allocator<char> local_2c1;
  NewOrderSingle local_2c0;
  Message local_168 [344];
  
  iVar2 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nNewOrderSingle\n");
  FIX::Message::Message(local_168);
  switch(iVar2) {
  case 0x28:
    queryNewOrderSingle40(&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x29:
    queryNewOrderSingle41((NewOrderSingle *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x2a:
    queryNewOrderSingle42((NewOrderSingle *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x2b:
    queryNewOrderSingle43((NewOrderSingle *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  case 0x2c:
    queryNewOrderSingle44((NewOrderSingle *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"No test for version ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    goto LAB_0011aa95;
  case 0x32:
    queryNewOrderSingle50((NewOrderSingle *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  FIX::Message::~Message((Message *)&local_2c0);
LAB_0011aa95:
  this_00 = (Application *)&local_2c0;
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"Send order",&local_2c1);
  bVar1 = queryConfirm(this_00,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
    FIX::Session::sendToTarget(local_168,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryEnterOrder() {
  int version = queryVersion();
  std::cout << "\nNewOrderSingle\n";
  FIX::Message order;

  switch (version) {
  case 40:
    order = queryNewOrderSingle40();
    break;
  case 41:
    order = queryNewOrderSingle41();
    break;
  case 42:
    order = queryNewOrderSingle42();
    break;
  case 43:
    order = queryNewOrderSingle43();
    break;
  case 44:
    order = queryNewOrderSingle44();
    break;
  case 50:
    order = queryNewOrderSingle50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send order")) {
    FIX::Session::sendToTarget(order);
  }
}